

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_header.c
# Opt level: O0

void cmime_header_free(CMimeHeader_T *header)

{
  ulong local_18;
  size_t i;
  CMimeHeader_T *header_local;
  
  if (header != (CMimeHeader_T *)0x0) {
    if (header->name != (char *)0x0) {
      free(header->name);
    }
    for (local_18 = 0; local_18 < header->count; local_18 = local_18 + 1) {
      if (header->value[local_18] != (char *)0x0) {
        free(header->value[local_18]);
      }
    }
    free(header->value);
    header->value = (char **)0x0;
    free(header);
    return;
  }
  __assert_fail("header",
                "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_header.c"
                ,0x28,"void cmime_header_free(CMimeHeader_T *)");
}

Assistant:

void cmime_header_free(CMimeHeader_T *header) {
    size_t i;
    assert(header);


    if (header->name != NULL)
        free(header->name);
        
    for(i = 0; i < header->count; i++) {
        if (header->value[i] != NULL) 
            free(header->value[i]);
    } 
    free(header->value);
    header->value = NULL;
    free(header); 
}